

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTime.c
# Opt level: O2

float If_ManDelayMax(If_Man_t *p,int fSeq)

{
  void *pvVar1;
  If_Par_t *pIVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  
  pIVar2 = p->pPars;
  if (pIVar2->fLatchPaths != 0) {
    if ((pIVar2->nLatchesCi != 0) && (pIVar2->nLatchesCo != 0)) {
      if (fSeq == 0) {
        fVar4 = -1e+20;
        for (iVar3 = p->nObjs[3] - pIVar2->nLatchesCo; iVar3 < p->vCos->nSize; iVar3 = iVar3 + 1) {
          pvVar1 = Vec_PtrEntry(p->vCos,iVar3);
          fVar5 = *(float *)(*(long *)((long)pvVar1 + 0x18) + 0x5c);
          if (fVar5 <= fVar4) {
            fVar5 = fVar4;
          }
          fVar4 = fVar5;
        }
        return fVar4;
      }
      goto LAB_0039302e;
    }
    Abc_Print((int)p,
              "Delay optimization of latch path is not performed because there is no latches.\n");
    pIVar2 = p->pPars;
    pIVar2->fLatchPaths = 0;
  }
  if (fSeq == 0) {
    fVar4 = -1e+20;
    for (iVar3 = 0; iVar3 < p->vCos->nSize; iVar3 = iVar3 + 1) {
      pvVar1 = Vec_PtrEntry(p->vCos,iVar3);
      fVar5 = *(float *)(*(long *)((long)pvVar1 + 0x18) + 0x5c);
      if (fVar5 <= fVar4) {
        fVar5 = fVar4;
      }
      fVar4 = fVar5;
    }
    return fVar4;
  }
LAB_0039302e:
  if (0 < pIVar2->nLatchesCi) {
    fVar4 = -1e+20;
    for (iVar3 = pIVar2->nLatchesCoBox; iVar3 < p->nObjs[3] - pIVar2->nLatchesCo; iVar3 = iVar3 + 1)
    {
      pvVar1 = Vec_PtrEntry(p->vCos,iVar3);
      fVar5 = *(float *)(*(long *)((long)pvVar1 + 0x18) + 0x5c);
      if (fVar5 <= fVar4) {
        fVar5 = fVar4;
      }
      pIVar2 = p->pPars;
      fVar4 = fVar5;
    }
    return fVar4;
  }
  __assert_fail("p->pPars->nLatchesCi > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTime.c"
                ,0x114,"float If_ManDelayMax(If_Man_t *, int)");
}

Assistant:

float If_ManDelayMax( If_Man_t * p, int fSeq )
{
    If_Obj_t * pObj;
    float DelayBest;
    int i;
    if ( p->pPars->fLatchPaths && (p->pPars->nLatchesCi == 0 || p->pPars->nLatchesCo == 0) )
    {
        Abc_Print( 0, "Delay optimization of latch path is not performed because there is no latches.\n" );
        p->pPars->fLatchPaths = 0;
    }
    DelayBest = -IF_FLOAT_LARGE;
    if ( fSeq )
    {
        assert( p->pPars->nLatchesCi > 0 );
        If_ManForEachPo( p, pObj, i )
            if ( DelayBest < If_ObjArrTime(If_ObjFanin0(pObj)) )
                 DelayBest = If_ObjArrTime(If_ObjFanin0(pObj));
    }
    else if ( p->pPars->fLatchPaths )
    {
        If_ManForEachLatchInput( p, pObj, i )
            if ( DelayBest < If_ObjArrTime(If_ObjFanin0(pObj)) )
                 DelayBest = If_ObjArrTime(If_ObjFanin0(pObj));
    }
    else 
    {
        If_ManForEachCo( p, pObj, i )
            if ( DelayBest < If_ObjArrTime(If_ObjFanin0(pObj)) )
                 DelayBest = If_ObjArrTime(If_ObjFanin0(pObj));
    }
    return DelayBest;
}